

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vcdgen.h
# Opt level: O0

void __thiscall VcdGen::VcdGenerator::generate_tick_data(VcdGenerator *this)

{
  bool bVar1;
  Type *__x;
  iterator __first;
  iterator __last;
  __tuple_element_t<0UL,_tuple<unsigned_long,_unsigned_int,_const_Signal_*>_> *p_Var2;
  __tuple_element_t<1UL,_tuple<unsigned_long,_unsigned_int,_const_Signal_*>_> *p_Var3;
  __tuple_element_t<2UL,_tuple<unsigned_long,_unsigned_int,_const_Signal_*>_> *ppSVar4;
  uint32_t in_ECX;
  string local_198;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_178;
  string local_158;
  string local_138;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_118;
  string local_f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  uint32_t local_94;
  Signal *pSStack_90;
  uint32_t width;
  Signal *signal;
  Type *pTStack_80;
  uint32_t value;
  uint64_t tick;
  tuple<unsigned_long,_unsigned_int,_const_VcdGen::Signal_*> *d;
  iterator __end2;
  iterator __begin2;
  Type *__range2;
  uint64_t tick_prev;
  undefined1 local_30 [8];
  Type data;
  TickData *tick_data;
  VcdGenerator *this_local;
  
  data.
  super__Vector_base<std::tuple<unsigned_long,_unsigned_int,_const_VcdGen::Signal_*>,_std::allocator<std::tuple<unsigned_long,_unsigned_int,_const_VcdGen::Signal_*>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)get_tick_data();
  __x = TickData::get_data((TickData *)
                           data.
                           super__Vector_base<std::tuple<unsigned_long,_unsigned_int,_const_VcdGen::Signal_*>,_std::allocator<std::tuple<unsigned_long,_unsigned_int,_const_VcdGen::Signal_*>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::
  vector<std::tuple<unsigned_long,_unsigned_int,_const_VcdGen::Signal_*>,_std::allocator<std::tuple<unsigned_long,_unsigned_int,_const_VcdGen::Signal_*>_>_>
  ::vector((vector<std::tuple<unsigned_long,_unsigned_int,_const_VcdGen::Signal_*>,_std::allocator<std::tuple<unsigned_long,_unsigned_int,_const_VcdGen::Signal_*>_>_>
            *)local_30,__x);
  __first = std::
            vector<std::tuple<unsigned_long,_unsigned_int,_const_VcdGen::Signal_*>,_std::allocator<std::tuple<unsigned_long,_unsigned_int,_const_VcdGen::Signal_*>_>_>
            ::begin((vector<std::tuple<unsigned_long,_unsigned_int,_const_VcdGen::Signal_*>,_std::allocator<std::tuple<unsigned_long,_unsigned_int,_const_VcdGen::Signal_*>_>_>
                     *)local_30);
  __last = std::
           vector<std::tuple<unsigned_long,_unsigned_int,_const_VcdGen::Signal_*>,_std::allocator<std::tuple<unsigned_long,_unsigned_int,_const_VcdGen::Signal_*>_>_>
           ::end((vector<std::tuple<unsigned_long,_unsigned_int,_const_VcdGen::Signal_*>,_std::allocator<std::tuple<unsigned_long,_unsigned_int,_const_VcdGen::Signal_*>_>_>
                  *)local_30);
  std::
  sort<__gnu_cxx::__normal_iterator<std::tuple<unsigned_long,unsigned_int,VcdGen::Signal_const*>*,std::vector<std::tuple<unsigned_long,unsigned_int,VcdGen::Signal_const*>,std::allocator<std::tuple<unsigned_long,unsigned_int,VcdGen::Signal_const*>>>>>
            ((__normal_iterator<std::tuple<unsigned_long,_unsigned_int,_const_VcdGen::Signal_*>_*,_std::vector<std::tuple<unsigned_long,_unsigned_int,_const_VcdGen::Signal_*>,_std::allocator<std::tuple<unsigned_long,_unsigned_int,_const_VcdGen::Signal_*>_>_>_>
              )__first._M_current,
             (__normal_iterator<std::tuple<unsigned_long,_unsigned_int,_const_VcdGen::Signal_*>_*,_std::vector<std::tuple<unsigned_long,_unsigned_int,_const_VcdGen::Signal_*>,_std::allocator<std::tuple<unsigned_long,_unsigned_int,_const_VcdGen::Signal_*>_>_>_>
              )__last._M_current);
  __range2 = (Type *)0xffffffffffffffff;
  __end2 = std::
           vector<std::tuple<unsigned_long,_unsigned_int,_const_VcdGen::Signal_*>,_std::allocator<std::tuple<unsigned_long,_unsigned_int,_const_VcdGen::Signal_*>_>_>
           ::begin((vector<std::tuple<unsigned_long,_unsigned_int,_const_VcdGen::Signal_*>,_std::allocator<std::tuple<unsigned_long,_unsigned_int,_const_VcdGen::Signal_*>_>_>
                    *)local_30);
  d = (tuple<unsigned_long,_unsigned_int,_const_VcdGen::Signal_*> *)
      std::
      vector<std::tuple<unsigned_long,_unsigned_int,_const_VcdGen::Signal_*>,_std::allocator<std::tuple<unsigned_long,_unsigned_int,_const_VcdGen::Signal_*>_>_>
      ::end((vector<std::tuple<unsigned_long,_unsigned_int,_const_VcdGen::Signal_*>,_std::allocator<std::tuple<unsigned_long,_unsigned_int,_const_VcdGen::Signal_*>_>_>
             *)local_30);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end2,(__normal_iterator<std::tuple<unsigned_long,_unsigned_int,_const_VcdGen::Signal_*>_*,_std::vector<std::tuple<unsigned_long,_unsigned_int,_const_VcdGen::Signal_*>,_std::allocator<std::tuple<unsigned_long,_unsigned_int,_const_VcdGen::Signal_*>_>_>_>
                                *)&d);
    if (!bVar1) break;
    tick = (uint64_t)
           __gnu_cxx::
           __normal_iterator<std::tuple<unsigned_long,_unsigned_int,_const_VcdGen::Signal_*>_*,_std::vector<std::tuple<unsigned_long,_unsigned_int,_const_VcdGen::Signal_*>,_std::allocator<std::tuple<unsigned_long,_unsigned_int,_const_VcdGen::Signal_*>_>_>_>
           ::operator*(&__end2);
    p_Var2 = std::get<0ul,unsigned_long,unsigned_int,VcdGen::Signal_const*>
                       ((tuple<unsigned_long,_unsigned_int,_const_VcdGen::Signal_*> *)tick);
    pTStack_80 = (Type *)*p_Var2;
    p_Var3 = std::get<1ul,unsigned_long,unsigned_int,VcdGen::Signal_const*>
                       ((tuple<unsigned_long,_unsigned_int,_const_VcdGen::Signal_*> *)tick);
    signal._4_4_ = *p_Var3;
    ppSVar4 = std::get<2ul,unsigned_long,unsigned_int,VcdGen::Signal_const*>
                        ((tuple<unsigned_long,_unsigned_int,_const_VcdGen::Signal_*> *)tick);
    pSStack_90 = *ppSVar4;
    local_94 = Signal::get_width(pSStack_90);
    if (__range2 != pTStack_80) {
      std::__cxx11::to_string(&local_f8,(unsigned_long)pTStack_80);
      std::operator+(&local_d8,"#",&local_f8);
      std::operator+(&local_b8,&local_d8,"\n");
      std::__cxx11::string::operator+=((string *)&this->vcd_data_,(string *)&local_b8);
      std::__cxx11::string::~string((string *)&local_b8);
      std::__cxx11::string::~string((string *)&local_d8);
      std::__cxx11::string::~string((string *)&local_f8);
    }
    if (local_94 < 2) {
      std::__cxx11::to_string(&local_158,signal._4_4_);
      std::__cxx11::string::operator+=((string *)&this->vcd_data_,(string *)&local_158);
      std::__cxx11::string::~string((string *)&local_158);
    }
    else {
      convert_to_binary_abi_cxx11_(&local_138,(VcdGen *)(ulong)signal._4_4_,local_94,in_ECX);
      std::operator+(&local_118,&local_138," ");
      std::__cxx11::string::operator+=((string *)&this->vcd_data_,(string *)&local_118);
      std::__cxx11::string::~string((string *)&local_118);
      std::__cxx11::string::~string((string *)&local_138);
    }
    Signal::get_encoded_name_abi_cxx11_(&local_198,pSStack_90);
    std::operator+(&local_178,&local_198,"\n");
    std::__cxx11::string::operator+=((string *)&this->vcd_data_,(string *)&local_178);
    std::__cxx11::string::~string((string *)&local_178);
    std::__cxx11::string::~string((string *)&local_198);
    __range2 = pTStack_80;
    __gnu_cxx::
    __normal_iterator<std::tuple<unsigned_long,_unsigned_int,_const_VcdGen::Signal_*>_*,_std::vector<std::tuple<unsigned_long,_unsigned_int,_const_VcdGen::Signal_*>,_std::allocator<std::tuple<unsigned_long,_unsigned_int,_const_VcdGen::Signal_*>_>_>_>
    ::operator++(&__end2);
  }
  std::
  vector<std::tuple<unsigned_long,_unsigned_int,_const_VcdGen::Signal_*>,_std::allocator<std::tuple<unsigned_long,_unsigned_int,_const_VcdGen::Signal_*>_>_>
  ::~vector((vector<std::tuple<unsigned_long,_unsigned_int,_const_VcdGen::Signal_*>,_std::allocator<std::tuple<unsigned_long,_unsigned_int,_const_VcdGen::Signal_*>_>_>
             *)local_30);
  return;
}

Assistant:

void generate_tick_data(){
        TickData &tick_data = get_tick_data();
        
        auto data = tick_data.get_data();

        sort(data.begin(), data.end());

        uint64_t tick_prev = -1;
        for( auto& d : data ) {

            #ifdef VCDGEN_DEBUG
                cout << "Time : " << get<0>(d) << "\t| Value : " << get<1>(d) << "\t| Name : " 
                     << get<2>(d)->get_name() << "\t| Symbol : " << get<2>(d)->get_encoded_name() 
                     << endl;
            #endif

            uint64_t tick  = get<0>(d); 
            uint32_t value = get<1>(d);
            const Signal* signal  = get<2>(d); 
            uint32_t width = signal->get_width();

            if( tick_prev != tick ){
                vcd_data_ += "#" + to_string(tick) + "\n";
            }
            if( width > 1 ){ 
                vcd_data_ += convert_to_binary(value, width) + " " ;
            } else {
                vcd_data_ += to_string(value);
            }
            vcd_data_ += signal->get_encoded_name() + "\n";
            tick_prev = tick;
        }
    }